

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RDX;
  undefined4 in_ESI;
  ExtensionSet *in_R8;
  ExtensionInfo extension;
  bool was_packed_on_wire;
  int number;
  FieldSkipper *in_stack_00000118;
  CodedInputStream *in_stack_00000120;
  ExtensionInfo *in_stack_00000128;
  bool in_stack_00000133;
  int in_stack_00000134;
  ExtensionSet *in_stack_00000138;
  bool *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  FieldDescriptor *in_stack_ffffffffffffffc0;
  uint32 in_stack_ffffffffffffffcc;
  bool local_1;
  
  ExtensionInfo::ExtensionInfo((ExtensionInfo *)&stack0xffffffffffffffa8);
  bVar1 = FindExtensionInfoFromTag
                    (in_R8,in_stack_ffffffffffffffcc,(ExtensionFinder *)in_stack_ffffffffffffffc0,
                     (int *)in_stack_ffffffffffffffb8,(ExtensionInfo *)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
  if (bVar1) {
    local_1 = ParseFieldWithExtensionInfo
                        (in_stack_00000138,in_stack_00000134,in_stack_00000133,in_stack_00000128,
                         in_stack_00000120,in_stack_00000118);
  }
  else {
    bVar2 = (**(code **)(in_R8->arena_ + 0x10))(in_R8,in_RDX,in_ESI);
    local_1 = (bool)(bVar2 & 1);
  }
  return local_1;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              ExtensionFinder* extension_finder,
                              FieldSkipper* field_skipper) {
  int number;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromTag(tag, extension_finder, &number, &extension,
                                &was_packed_on_wire)) {
    return field_skipper->SkipField(input, tag);
  } else {
    return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                       input, field_skipper);
  }
}